

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_deposit_z_i32_sparc64
               (TCGContext_conflict8 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg,uint ofs,uint len)

{
  TCGv_i32 a2;
  TCGv_i32 zero;
  uint len_local;
  uint ofs_local;
  TCGv_i32 arg_local;
  TCGv_i32 ret_local;
  TCGContext_conflict8 *tcg_ctx_local;
  
  if (ofs + len == 0x20) {
    tcg_gen_shli_i32_sparc64(tcg_ctx,ret,arg,ofs);
  }
  else if (ofs == 0) {
    tcg_gen_andi_i32_sparc64(tcg_ctx,ret,arg,(1 << ((byte)len & 0x1f)) + -1);
  }
  else if ((((ofs == 0) && (len == 8)) || ((ofs == 8 && (len == 8)))) ||
          ((ofs == 0 && (len == 0x10)))) {
    a2 = tcg_const_i32_sparc64(tcg_ctx,0);
    tcg_gen_op5ii_i32(tcg_ctx,INDEX_op_deposit_i32,ret,a2,arg,(ulong)ofs,(ulong)len);
    tcg_temp_free_i32(tcg_ctx,a2);
  }
  else if (len == 8) {
    tcg_gen_ext8u_i32_sparc64(tcg_ctx,ret,arg);
    tcg_gen_shli_i32_sparc64(tcg_ctx,ret,ret,ofs);
  }
  else if (len == 0x10) {
    tcg_gen_ext16u_i32_sparc64(tcg_ctx,ret,arg);
    tcg_gen_shli_i32_sparc64(tcg_ctx,ret,ret,ofs);
  }
  else if (ofs + len == 8) {
    tcg_gen_shli_i32_sparc64(tcg_ctx,ret,arg,ofs);
    tcg_gen_ext8u_i32_sparc64(tcg_ctx,ret,ret);
  }
  else if (ofs + len == 0x10) {
    tcg_gen_shli_i32_sparc64(tcg_ctx,ret,arg,ofs);
    tcg_gen_ext16u_i32_sparc64(tcg_ctx,ret,ret);
  }
  else {
    tcg_gen_andi_i32_sparc64(tcg_ctx,ret,arg,(1 << ((byte)len & 0x1f)) + -1);
    tcg_gen_shli_i32_sparc64(tcg_ctx,ret,ret,ofs);
  }
  return;
}

Assistant:

void tcg_gen_deposit_z_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg,
                           unsigned int ofs, unsigned int len)
{
    tcg_debug_assert(ofs < 32);
    tcg_debug_assert(len > 0);
    tcg_debug_assert(len <= 32);
    tcg_debug_assert(ofs + len <= 32);

    if (ofs + len == 32) {
        tcg_gen_shli_i32(tcg_ctx, ret, arg, ofs);
    } else if (ofs == 0) {
        tcg_gen_andi_i32(tcg_ctx, ret, arg, (1u << len) - 1);
    } else if (TCG_TARGET_HAS_deposit_i32
               && TCG_TARGET_deposit_i32_valid(ofs, len)) {
        TCGv_i32 zero = tcg_const_i32(tcg_ctx, 0);
        tcg_gen_op5ii_i32(tcg_ctx, INDEX_op_deposit_i32, ret, zero, arg, ofs, len);
        tcg_temp_free_i32(tcg_ctx, zero);
    } else {
        /* To help two-operand hosts we prefer to zero-extend first,
           which allows ARG to stay live.  */
        switch (len) {
        case 16:
            if (TCG_TARGET_HAS_ext16u_i32) {
                tcg_gen_ext16u_i32(tcg_ctx, ret, arg);
                tcg_gen_shli_i32(tcg_ctx, ret, ret, ofs);
                return;
            }
            break;
        case 8:
            if (TCG_TARGET_HAS_ext8u_i32) {
                tcg_gen_ext8u_i32(tcg_ctx, ret, arg);
                tcg_gen_shli_i32(tcg_ctx, ret, ret, ofs);
                return;
            }
            break;
        }
        /* Otherwise prefer zero-extension over AND for code size.  */
        switch (ofs + len) {
        case 16:
            if (TCG_TARGET_HAS_ext16u_i32) {
                tcg_gen_shli_i32(tcg_ctx, ret, arg, ofs);
                tcg_gen_ext16u_i32(tcg_ctx, ret, ret);
                return;
            }
            break;
        case 8:
            if (TCG_TARGET_HAS_ext8u_i32) {
                tcg_gen_shli_i32(tcg_ctx, ret, arg, ofs);
                tcg_gen_ext8u_i32(tcg_ctx, ret, ret);
                return;
            }
            break;
        }
        tcg_gen_andi_i32(tcg_ctx, ret, arg, (1u << len) - 1);
        tcg_gen_shli_i32(tcg_ctx, ret, ret, ofs);
    }
}